

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

string * __thiscall
BmsParseInvalidCharAsHeaderOrBarException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsParseInvalidCharAsHeaderOrBarException *this)

{
  stringstream os;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,anon_var_dwarf_3a717,0x60);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(this->super_BmsParseInvalidCharException).str_._M_dataplus._M_p,
             (this->super_BmsParseInvalidCharException).str_._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsParseInvalidCharAsHeaderOrBarException::Message( void ) const
{
  std::stringstream os;
  os << "ヘッダ名または小節番号として不正な文字が指定されました。文字列 : " << this->GetString();
  return os.str();
}